

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O1

void __thiscall CS248::DynamicScene::XFormWidget::XFormWidget(XFormWidget *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR___cxa_pure_virtual_00266720;
  p_Var1 = &(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header;
  (this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  (this->super_SceneObject).scene = (Scene *)0x0;
  (this->super_SceneObject).position.x = 0.0;
  (this->super_SceneObject).position.y = 0.0;
  (this->super_SceneObject).position.z = 0.0;
  (this->super_SceneObject).rotation.x = 0.0;
  (this->super_SceneObject).rotation.y = 0.0;
  (this->super_SceneObject).rotation.z = 0.0;
  (this->super_SceneObject).scale.x = 0.0;
  (this->super_SceneObject).scale.y = 0.0;
  (this->super_SceneObject).scale.z = 0.0;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header;
  (this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header;
  (this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header + 8)
       = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_SceneObject).isVisible = true;
  (this->super_SceneObject).isGhosted = false;
  (this->super_SceneObject).isPickable = true;
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00266828;
  (this->target).coordinates.z = 0.0;
  (this->target).coordinates.x = 0.0;
  (this->target).coordinates.y = 0.0;
  (this->target).object = (SceneObject *)0x0;
  (this->target).element = (HalfedgeElement *)0x0;
  (this->target).axis = None;
  p_Var1 = &(this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->axes).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->axes).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->axes).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bounds).max.x = -INFINITY;
  (this->bounds).max.y = -INFINITY;
  (this->bounds).max.z = -INFINITY;
  (this->bounds).min.x = INFINITY;
  (this->bounds).min.y = INFINITY;
  (this->bounds).min.z = INFINITY;
  (this->bounds).extent.x = -INFINITY;
  (this->bounds).extent.y = -INFINITY;
  (this->bounds).extent.z = -INFINITY;
  this->mode = Translate;
  this->lastMode = Translate;
  (this->center).x = 0.0;
  (this->center).y = 0.0;
  *(undefined8 *)((long)&(this->center).y + 4) = 0;
  *(undefined8 *)((long)&(this->center).z + 4) = 0;
  (this->axisColors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->axisColors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->axisColors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clickPosition).x = 0.0;
  (this->clickPosition).y = 0.0;
  return;
}

Assistant:

SceneObject()
      : scene(NULL), isVisible(true), isGhosted(false), isPickable(true) {}